

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-pending-instances.c
# Opt level: O1

int run_test_pipe_pending_instances(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  uv_pipe_t pipe_handle;
  uv_pipe_t uStack_118;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&uStack_118,0);
  if (iVar1 == 0) {
    uv_pipe_pending_instances(&uStack_118,8);
    iVar1 = uv_pipe_bind(&uStack_118,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_001635c8;
    uv_pipe_pending_instances(&uStack_118,0x10);
    iVar1 = uv_listen((uv_stream_t *)&uStack_118,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_001635cd;
    uv_close((uv_handle_t *)&uStack_118,(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001635d7;
    }
  }
  else {
    run_test_pipe_pending_instances_cold_1();
LAB_001635c8:
    run_test_pipe_pending_instances_cold_2();
LAB_001635cd:
    run_test_pipe_pending_instances_cold_3();
  }
  run_test_pipe_pending_instances_cold_4();
LAB_001635d7:
  run_test_pipe_pending_instances_cold_5();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-pending-instances.c"
          ,0x1c,"0 && \"this will never be called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(pipe_pending_instances) {
  int r;
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT(r == 0);

  uv_pipe_pending_instances(&pipe_handle, 8);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT(r == 0);

  uv_pipe_pending_instances(&pipe_handle, 16);

  r = uv_listen((uv_stream_t*)&pipe_handle, 128, connection_cb);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&pipe_handle, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}